

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

void __thiscall
icu_63::DateTimePatternGenerator::AppendItemNamesSink::fillInMissing(AppendItemNamesSink *this)

{
  UBool UVar1;
  UnicodeString local_70;
  UnicodeString *local_30;
  UnicodeString *valueStr2;
  UnicodeString *pUStack_20;
  int32_t j;
  UnicodeString *valueStr;
  AppendItemNamesSink *pAStack_10;
  int32_t i;
  AppendItemNamesSink *this_local;
  
  pAStack_10 = this;
  for (valueStr._4_4_ = UDATPG_ERA_FIELD; (int)valueStr._4_4_ < 0x10;
      valueStr._4_4_ = valueStr._4_4_ + UDATPG_YEAR_FIELD) {
    pUStack_20 = getMutableFieldDisplayName(this->dtpg,valueStr._4_4_,UDATPG_WIDE);
    UVar1 = icu_63::UnicodeString::isEmpty(pUStack_20);
    if (UVar1 != '\0') {
      icu_63::UnicodeString::operator=(pUStack_20,L'F');
      if ((int)valueStr._4_4_ < 10) {
        icu_63::UnicodeString::operator+=(pUStack_20,(short)valueStr._4_4_ + L'0');
      }
      else {
        icu_63::UnicodeString::operator+=(pUStack_20,L'1');
        icu_63::UnicodeString::operator+=(pUStack_20,(short)valueStr._4_4_ + L'&');
      }
      icu_63::UnicodeString::getTerminatedBuffer(pUStack_20);
    }
    for (valueStr2._4_4_ = UDATPG_ABBREVIATED; (int)valueStr2._4_4_ < 3;
        valueStr2._4_4_ = valueStr2._4_4_ + UDATPG_ABBREVIATED) {
      local_30 = getMutableFieldDisplayName(this->dtpg,valueStr._4_4_,valueStr2._4_4_);
      UVar1 = icu_63::UnicodeString::isEmpty(local_30);
      if (UVar1 != '\0') {
        getFieldDisplayName(&local_70,this->dtpg,valueStr._4_4_,valueStr2._4_4_ - UDATPG_ABBREVIATED
                           );
        icu_63::UnicodeString::operator=(local_30,&local_70);
        icu_63::UnicodeString::~UnicodeString(&local_70);
      }
    }
  }
  return;
}

Assistant:

void fillInMissing() {
        for (int32_t i = 0; i < UDATPG_FIELD_COUNT; i++) {
            UnicodeString& valueStr = dtpg.getMutableFieldDisplayName((UDateTimePatternField)i, UDATPG_WIDE);
            if (valueStr.isEmpty()) {
                valueStr = CAP_F;
                U_ASSERT(i < 20);
                if (i < 10) {
                    // F0, F1, ..., F9
                    valueStr += (UChar)(i+0x30);
                } else {
                    // F10, F11, ...
                    valueStr += (UChar)0x31;
                    valueStr += (UChar)(i-10 + 0x30);
                }
                // NUL-terminate for the C API.
                valueStr.getTerminatedBuffer();
            }
            for (int32_t j = 1; j < UDATPG_WIDTH_COUNT; j++) {
                UnicodeString& valueStr2 = dtpg.getMutableFieldDisplayName((UDateTimePatternField)i, (UDateTimePGDisplayWidth)j);
                if (valueStr2.isEmpty()) {
                    valueStr2 = dtpg.getFieldDisplayName((UDateTimePatternField)i, (UDateTimePGDisplayWidth)(j-1));
                }
            }
        }
    }